

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

void Ivy_ManCutTruthOne(Ivy_Man_t *p,Ivy_Obj_t *pNode,Vec_Int_t *vTruth,int nWords)

{
  int *piVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pIVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  piVar1 = vTruth->pArray;
  iVar4 = pNode->TravId << 3;
  pIVar2 = pNode->pFanin0;
  iVar5 = *(int *)(((ulong)pIVar2 & 0xfffffffffffffffe) + 4) << 3;
  pIVar3 = pNode->pFanin1;
  iVar6 = *(int *)(((ulong)pIVar3 & 0xfffffffffffffffe) + 4) << 3;
  if ((*(uint *)&pNode->field_0x8 & 0xf) == 6) {
    if (0 < nWords) {
      uVar7 = 0;
      do {
        piVar1[(long)iVar4 + uVar7] = piVar1[(long)iVar6 + uVar7] ^ piVar1[(long)iVar5 + uVar7];
        uVar7 = uVar7 + 1;
      } while ((uint)nWords != uVar7);
    }
  }
  else if ((((uint)pIVar3 | (uint)pIVar2) & 1) == 0) {
    if (0 < nWords) {
      uVar7 = 0;
      do {
        piVar1[(long)iVar4 + uVar7] = piVar1[(long)iVar6 + uVar7] & piVar1[(long)iVar5 + uVar7];
        uVar7 = uVar7 + 1;
      } while ((uint)nWords != uVar7);
    }
  }
  else if (((ulong)pIVar3 & 1) == 0 || ((ulong)pIVar2 & 1) != 0) {
    if (((byte)pIVar2 & ((ulong)pIVar3 & 1) == 0) == 0) {
      if (0 < nWords) {
        uVar7 = 0;
        do {
          piVar1[(long)iVar4 + uVar7] = ~(piVar1[(long)iVar6 + uVar7] | piVar1[(long)iVar5 + uVar7])
          ;
          uVar7 = uVar7 + 1;
        } while ((uint)nWords != uVar7);
      }
    }
    else if (0 < nWords) {
      uVar7 = 0;
      do {
        piVar1[(long)iVar4 + uVar7] = ~piVar1[(long)iVar5 + uVar7] & piVar1[(long)iVar6 + uVar7];
        uVar7 = uVar7 + 1;
      } while ((uint)nWords != uVar7);
    }
  }
  else if (0 < nWords) {
    uVar7 = 0;
    do {
      piVar1[(long)iVar4 + uVar7] = ~piVar1[(long)iVar6 + uVar7] & piVar1[(long)iVar5 + uVar7];
      uVar7 = uVar7 + 1;
    } while ((uint)nWords != uVar7);
  }
  return;
}

Assistant:

static inline int * Vec_IntArray( Vec_Int_t * p )
{
    return p->pArray;
}